

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_db_ip_white_list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3d2a9::
Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Json2Array(Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_local;
  Value *value_local;
  Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.field_2._12_4_ = 0; uVar1 = val.field_2._12_4_, AVar3 = Json::Value::size(value),
        (uint)uVar1 < AVar3; val.field_2._12_4_ = val.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)local_48);
      value_00 = Json::Value::operator[](value,val.field_2._12_4_);
      anon_unknown.dwarf_3d2a9::Json2Type(value_00,(string *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(vec,(value_type *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }